

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebSocketProtocol.h
# Opt level: O0

void uWS::WebSocketProtocol<true,_uWS::WebSocketContext<true,_true>_>::consume
               (char *src,uint length,WebSocketState<true> *wState,void *user)

{
  bool bVar1;
  byte bVar2;
  uchar uVar3;
  unsigned_short value;
  unsigned_long value_00;
  WebSocketState<true> *in_RCX;
  WebSocketState<true> *in_RDX;
  uint in_ESI;
  WebSocketState<true> *in_RDI;
  WebSocketState<true> *unaff_retaddr;
  undefined4 in_stack_00000018;
  void *in_stack_ffffffffffffffd8;
  undefined4 in_stack_fffffffffffffff0;
  
  if ((*(byte *)&in_RDX->state >> 1 & 0xf) != 0) {
    in_RDI = (WebSocketState<true> *)
             ((long)in_RDI - (long)(int)(uint)(*(byte *)&in_RDX->state >> 1 & 0xf));
    in_ESI = (*(byte *)&in_RDX->state >> 1 & 0xf) + in_ESI;
    memcpy(in_RDI,(in_RDX->state).spill,(ulong)(*(byte *)&in_RDX->state >> 1 & 0xf));
  }
  if (((undefined1  [16])((undefined1  [16])in_RDX->state & (undefined1  [16])0x1) !=
       (undefined1  [16])0x0) ||
     (bVar1 = consumeContinuation((char **)user,(uint *)unaff_retaddr,in_RDI,
                                  (void *)CONCAT44(in_ESI,in_stack_fffffffffffffff0)), bVar1)) {
LAB_002714e1:
    do {
      if (in_ESI < 6) {
LAB_00271692:
        if (in_ESI == 0) {
          return;
        }
        memcpy((in_RDX->state).spill,in_RDI,(ulong)in_ESI);
        *(byte *)&in_RDX->state = *(byte *)&in_RDX->state & 0xe1 | ((byte)in_ESI & 0xf) << 1;
        return;
      }
      bVar1 = rsv1((char *)in_RDI);
      if ((((((bVar1) &&
             (bVar1 = WebSocketContext<true,_true>::setCompressed(in_RDX,in_RCX), !bVar1)) ||
            (bVar1 = rsv23((char *)in_RDI), bVar1)) ||
           ((bVar2 = getOpCode((char *)in_RDI), 2 < bVar2 &&
            (bVar2 = getOpCode((char *)in_RDI), bVar2 < 8)))) ||
          (bVar2 = getOpCode((char *)in_RDI), 10 < bVar2)) ||
         ((bVar2 = getOpCode((char *)in_RDI), 2 < bVar2 &&
          ((bVar1 = isFin((char *)in_RDI), !bVar1 ||
           (bVar2 = payloadLength((char *)in_RDI), 0x7d < bVar2)))))) {
        WebSocketContext<true,_true>::forceClose(in_RCX,in_stack_ffffffffffffffd8);
        return;
      }
      bVar2 = payloadLength((char *)in_RDI);
      if (bVar2 < 0x7e) {
        payloadLength((char *)in_RDI);
        bVar1 = WebSocketProtocol<true,uWS::WebSocketContext<true,true>>::
                consumeMessage<6u,unsigned_char>
                          (wState._6_1_,(char **)user,(uint *)unaff_retaddr,in_RDI,
                           (void *)CONCAT44(in_ESI,in_stack_fffffffffffffff0));
        if (bVar1) {
          return;
        }
        goto LAB_002714e1;
      }
      uVar3 = payloadLength((char *)in_RDI);
      if (uVar3 == '~') {
        if (in_ESI < 8) goto LAB_00271692;
        value = protocol::bit_cast<unsigned_short>((char *)((in_RDI->state).spill + 1));
        protocol::cond_byte_swap<unsigned_short>(value);
        bVar1 = WebSocketProtocol<true,uWS::WebSocketContext<true,true>>::
                consumeMessage<8u,unsigned_short>
                          (wState._4_2_,(char **)user,(uint *)unaff_retaddr,in_RDI,
                           (void *)CONCAT44(in_ESI,in_stack_fffffffffffffff0));
        if (bVar1) {
          return;
        }
        goto LAB_002714e1;
      }
      if (in_ESI < 0xe) goto LAB_00271692;
      value_00 = protocol::bit_cast<unsigned_long>((char *)((in_RDI->state).spill + 1));
      protocol::cond_byte_swap<unsigned_long>(value_00);
      bVar1 = WebSocketProtocol<true,uWS::WebSocketContext<true,true>>::
              consumeMessage<14u,unsigned_long>
                        (CONCAT44(length,in_stack_00000018),(char **)wState,(uint *)user,
                         unaff_retaddr,in_RDI);
    } while (!bVar1);
  }
  return;
}

Assistant:

static inline void consume(char *src, unsigned int length, WebSocketState<isServer> *wState, void *user) {
        if (wState->state.spillLength) {
            src -= wState->state.spillLength;
            length += wState->state.spillLength;
            memcpy(src, wState->state.spill, wState->state.spillLength);
        }
        if (wState->state.wantsHead) {
            parseNext:
            while (length >= SHORT_MESSAGE_HEADER) {

                // invalid reserved bits / invalid opcodes / invalid control frames / set compressed frame
                if ((rsv1(src) && !Impl::setCompressed(wState, user)) || rsv23(src) || (getOpCode(src) > 2 && getOpCode(src) < 8) ||
                    getOpCode(src) > 10 || (getOpCode(src) > 2 && (!isFin(src) || payloadLength(src) > 125))) {
                    Impl::forceClose(wState, user);
                    return;
                }

                if (payloadLength(src) < 126) {
                    if (consumeMessage<SHORT_MESSAGE_HEADER, uint8_t>(payloadLength(src), src, length, wState, user)) {
                        return;
                    }
                } else if (payloadLength(src) == 126) {
                    if (length < MEDIUM_MESSAGE_HEADER) {
                        break;
                    } else if(consumeMessage<MEDIUM_MESSAGE_HEADER, uint16_t>(protocol::cond_byte_swap<uint16_t>(protocol::bit_cast<uint16_t>(src + 2)), src, length, wState, user)) {
                        return;
                    }
                } else if (length < LONG_MESSAGE_HEADER) {
                    break;
                } else if (consumeMessage<LONG_MESSAGE_HEADER, uint64_t>(protocol::cond_byte_swap<uint64_t>(protocol::bit_cast<uint64_t>(src + 2)), src, length, wState, user)) {
                    return;
                }
            }
            if (length) {
                memcpy(wState->state.spill, src, length);
                wState->state.spillLength = length & 0xf;
            }
        } else if (consumeContinuation(src, length, wState, user)) {
            goto parseNext;
        }
    }